

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O0

string * namingConventions::getFileName(string *__return_storage_ptr__,string *filePath)

{
  char *pcVar1;
  ulong uVar2;
  uint local_1c;
  uint pos;
  string *filePath_local;
  string *fileName;
  
  local_1c = std::__cxx11::string::size();
  do {
    local_1c = local_1c - 1;
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)filePath);
  } while (*pcVar1 != '/');
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (; uVar2 = std::__cxx11::string::size(), local_1c != uVar2; local_1c = local_1c + 1) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)filePath);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string namingConventions::getFileName(const std::string &filePath) {
    unsigned int pos = filePath.size() - 1;
    while (filePath[pos - 1] != '/') {
        pos -= 1;
    }
    std::string fileName;
    while (pos != filePath.size()) {
        fileName += filePath[pos];
        pos += 1;
    }
    return fileName;
}